

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PcaModel.hpp
# Opt level: O0

MatrixXf * __thiscall
eos::morphablemodel::PcaModel::get_rescaled_pca_basis_at_point
          (MatrixXf *__return_storage_ptr__,PcaModel *this,int vertex_id)

{
  int iVar1;
  long startRow;
  Index blockCols;
  Type local_58;
  int local_1c;
  PcaModel *pPStack_18;
  int vertex_id_local;
  PcaModel *this_local;
  
  local_1c = vertex_id * 3;
  pPStack_18 = this;
  this_local = (PcaModel *)__return_storage_ptr__;
  iVar1 = get_data_dimension(this);
  if (vertex_id * 3 < iVar1) {
    startRow = (long)local_1c;
    blockCols = Eigen::PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                          (&(this->rescaled_pca_basis).
                            super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    Eigen::DenseBase<Eigen::Matrix<float,-1,-1,0,-1,-1>>::block<int,long>
              (&local_58,(DenseBase<Eigen::Matrix<float,_1,_1,0,_1,_1>> *)&this->rescaled_pca_basis,
               startRow,0,3,blockCols);
    Eigen::Matrix<float,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,_1,false>>
              ((Matrix<float,_1,_1,0,_1,_1> *)__return_storage_ptr__,
               (EigenBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                *)&local_58);
    return __return_storage_ptr__;
  }
  __assert_fail("vertex_id < get_data_dimension()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/morphablemodel/PcaModel.hpp"
                ,0xe2,
                "Eigen::MatrixXf eos::morphablemodel::PcaModel::get_rescaled_pca_basis_at_point(int) const"
               );
}

Assistant:

Eigen::MatrixXf get_rescaled_pca_basis_at_point(int vertex_id) const
    {
        vertex_id *= 3;                           // the basis is stored in the format [x y z x y z ...]
        assert(vertex_id < get_data_dimension()); // Make sure the given vertex index isn't larger than the
                                                  // number of model vertices.
        return rescaled_pca_basis.block(vertex_id, 0, 3, rescaled_pca_basis.cols());
    }